

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O0

void __thiscall t_perl_generator::generate_service_rest(t_perl_generator *this,t_service *tservice)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  undefined4 extraout_var;
  t_program *p;
  undefined4 extraout_var_00;
  ostream *poVar4;
  ulong uVar5;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  reference pptVar6;
  string *psVar7;
  t_struct *ptVar8;
  reference pptVar9;
  t_type *type;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  undefined1 local_218 [8];
  string req;
  t_type *atype;
  t_field **local_1e8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_1e0
  ;
  const_iterator a_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *args;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_1b0;
  t_function **local_1a8;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_1a0;
  iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  t_service *local_80;
  t_service *extends_s;
  string local_70 [8];
  string extends_if;
  allocator local_39;
  string local_38 [8];
  string extends;
  t_service *tservice_local;
  t_perl_generator *this_local;
  
  extends.field_2._8_8_ = tservice;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"",(allocator *)((long)&extends_s + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&extends_s + 7));
  local_80 = t_service::get_extends((t_service *)extends.field_2._8_8_);
  if (local_80 != (t_service *)0x0) {
    iVar3 = (*(local_80->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::__cxx11::string::operator=(local_38,(string *)CONCAT44(extraout_var,iVar3));
    p = t_type::get_program(&local_80->super_t_type);
    perl_namespace_abi_cxx11_(&local_100,this,p);
    std::operator+(&local_e0,"use base qw(",&local_100);
    iVar3 = (*(local_80->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::operator+(&local_c0,&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var_00,iVar3));
    std::operator+(&local_a0,&local_c0,"Rest);");
    std::__cxx11::string::operator=(local_70,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
  }
  poVar4 = std::operator<<((ostream *)&this->f_service_,"package ");
  perl_namespace_abi_cxx11_
            (&local_120,this,(this->super_t_oop_generator).super_t_generator.program_);
  poVar4 = std::operator<<(poVar4,(string *)&local_120);
  poVar4 = std::operator<<(poVar4,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.service_name_);
  poVar4 = std::operator<<(poVar4,"Rest;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"use strict;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,local_70);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_120);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&this->f_service_,"sub new {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_140);
    poVar4 = std::operator<<(poVar4,"my ($classname, $impl) = @_;");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_160);
    poVar4 = std::operator<<(poVar4,"my $self     ={ impl => $impl };");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_
              ((string *)
               &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)
                                    &functions.
                                     super__Vector_base<t_function_*,_std::allocator<t_function_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar4 = std::operator<<(poVar4,"return bless($self,$classname);");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string
              ((string *)
               &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_140);
    t_generator::indent_down((t_generator *)this);
    poVar4 = std::operator<<((ostream *)&this->f_service_,"}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  __x = t_service::get_functions((t_service *)extends.field_2._8_8_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
  __normal_iterator(&local_1a0);
  local_1a8 = (t_function **)
              std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                        ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  local_1a0._M_current = local_1a8;
  while( true ) {
    local_1b0._M_current =
         (t_function **)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar1 = __gnu_cxx::operator!=(&local_1a0,&local_1b0);
    if (!bVar1) break;
    poVar4 = std::operator<<((ostream *)&this->f_service_,"sub ");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_1a0);
    psVar7 = t_function::get_name_abi_cxx11_(*pptVar6);
    poVar4 = std::operator<<(poVar4,(string *)psVar7);
    poVar4 = std::operator<<(poVar4,"{");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up((t_generator *)this);
    t_generator::indent_abi_cxx11_((string *)&args,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&args);
    poVar4 = std::operator<<(poVar4,"my ($self, $request) = @_;");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&args);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_1a0);
    ptVar8 = t_function::get_arglist(*pptVar6);
    a_iter._M_current = (t_field **)t_struct::get_members(ptVar8);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    __normal_iterator(&local_1e0);
    local_1e8 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(a_iter._M_current);
    local_1e0._M_current = local_1e8;
    while( true ) {
      atype = (t_type *)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                        ((vector<t_field_*,_std::allocator<t_field_*>_> *)a_iter._M_current);
      bVar1 = __gnu_cxx::operator!=
                        (&local_1e0,
                         (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&atype);
      if (!bVar1) break;
      pptVar9 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_1e0);
      type = t_field::get_type(*pptVar9);
      req.field_2._8_8_ = t_generator::get_true_type(type);
      pptVar9 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_1e0);
      psVar7 = t_field::get_name_abi_cxx11_(*pptVar9);
      std::operator+(&local_238,"$request->{\'",psVar7);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
                     &local_238,"\'}");
      std::__cxx11::string::~string((string *)&local_238);
      t_generator::indent_abi_cxx11_(&local_258,(t_generator *)this);
      poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_258);
      poVar4 = std::operator<<(poVar4,"my $");
      pptVar9 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_1e0);
      psVar7 = t_field::get_name_abi_cxx11_(*pptVar9);
      poVar4 = std::operator<<(poVar4,(string *)psVar7);
      poVar4 = std::operator<<(poVar4," = (");
      poVar4 = std::operator<<(poVar4,(string *)local_218);
      poVar4 = std::operator<<(poVar4,") ? ");
      poVar4 = std::operator<<(poVar4,(string *)local_218);
      poVar4 = std::operator<<(poVar4," : undef;");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_258);
      bVar2 = (**(code **)(*(long *)req.field_2._8_8_ + 0x30))();
      if (((bVar2 & 1) != 0) &&
         (bVar1 = t_base_type::is_string_list((t_base_type *)req.field_2._8_8_), bVar1)) {
        t_generator::indent_abi_cxx11_(&local_278,(t_generator *)this);
        poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_278);
        poVar4 = std::operator<<(poVar4,"my @");
        pptVar9 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_1e0);
        psVar7 = t_field::get_name_abi_cxx11_(*pptVar9);
        poVar4 = std::operator<<(poVar4,(string *)psVar7);
        poVar4 = std::operator<<(poVar4," = split(/,/, $");
        pptVar9 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_1e0);
        psVar7 = t_field::get_name_abi_cxx11_(*pptVar9);
        poVar4 = std::operator<<(poVar4,(string *)psVar7);
        poVar4 = std::operator<<(poVar4,");");
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_298,(t_generator *)this);
        poVar4 = std::operator<<(poVar4,(string *)&local_298);
        poVar4 = std::operator<<(poVar4,"$");
        pptVar9 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_1e0);
        psVar7 = t_field::get_name_abi_cxx11_(*pptVar9);
        poVar4 = std::operator<<(poVar4,(string *)psVar7);
        poVar4 = std::operator<<(poVar4," = \\@");
        pptVar9 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_1e0);
        psVar7 = t_field::get_name_abi_cxx11_(*pptVar9);
        poVar4 = std::operator<<(poVar4,(string *)psVar7);
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&local_278);
      }
      std::__cxx11::string::~string((string *)local_218);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_1e0);
    }
    t_generator::indent_abi_cxx11_(&local_2b8,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_2b8);
    poVar4 = std::operator<<(poVar4,"return $self->{impl}->");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_1a0);
    psVar7 = t_function::get_name_abi_cxx11_(*pptVar6);
    poVar4 = std::operator<<(poVar4,(string *)psVar7);
    poVar4 = std::operator<<(poVar4,"(");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_1a0);
    ptVar8 = t_function::get_arglist(*pptVar6);
    argument_list_abi_cxx11_(&local_2d8,this,ptVar8);
    poVar4 = std::operator<<(poVar4,(string *)&local_2d8);
    poVar4 = std::operator<<(poVar4,");");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2b8);
    t_generator::indent_down((t_generator *)this);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++(&local_1a0);
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void t_perl_generator::generate_service_rest(t_service* tservice) {
  string extends = "";
  string extends_if = "";
  t_service* extends_s = tservice->get_extends();
  if (extends_s != nullptr) {
    extends = extends_s->get_name();
    extends_if = "use base qw(" + perl_namespace(extends_s->get_program()) + extends_s->get_name()
                 + "Rest);";
  }
  f_service_ << "package " << perl_namespace(program_) << service_name_ << "Rest;" << endl << endl
             << "use strict;" << endl << extends_if << endl << endl;

  if (extends.empty()) {
    f_service_ << "sub new {" << endl;

    indent_up();

    f_service_ << indent() << "my ($classname, $impl) = @_;" << endl << indent()
               << "my $self     ={ impl => $impl };" << endl << endl << indent()
               << "return bless($self,$classname);" << endl;

    indent_down();

    f_service_ << "}" << endl << endl;
  }

  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    f_service_ << "sub " << (*f_iter)->get_name() << "{" << endl;

    indent_up();

    f_service_ << indent() << "my ($self, $request) = @_;" << endl << endl;

    const vector<t_field*>& args = (*f_iter)->get_arglist()->get_members();
    vector<t_field*>::const_iterator a_iter;
    for (a_iter = args.begin(); a_iter != args.end(); ++a_iter) {
      t_type* atype = get_true_type((*a_iter)->get_type());
      string req = "$request->{'" + (*a_iter)->get_name() + "'}";
      f_service_ << indent() << "my $" << (*a_iter)->get_name() << " = (" << req << ") ? " << req
                 << " : undef;" << endl;
      if (atype->is_string() && ((t_base_type*)atype)->is_string_list()) {
        f_service_ << indent() << "my @" << (*a_iter)->get_name() << " = split(/,/, $"
                   << (*a_iter)->get_name() << ");" << endl << indent() << "$"
                   << (*a_iter)->get_name() << " = \\@" << (*a_iter)->get_name() << endl;
      }
    }
    f_service_ << indent() << "return $self->{impl}->" << (*f_iter)->get_name() << "("
               << argument_list((*f_iter)->get_arglist()) << ");" << endl;
    indent_down();
    indent(f_service_) << "}" << endl << endl;
  }
}